

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_insert_at_char(nk_str *s,int pos,char *str,int len)

{
  int iVar1;
  void *pvVar2;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  int copylen;
  char *dst;
  char *src;
  void *mem;
  int i;
  char *in_stack_ffffffffffffffc0;
  undefined1 *puVar3;
  nk_str *in_stack_ffffffffffffffc8;
  undefined1 *puVar4;
  int iVar5;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RDX == (void *)0x0)) || (in_ECX == 0)) ||
     (*(ulong *)(in_RDI + 0x58) < (ulong)(long)in_ESI)) {
    local_4 = 0;
  }
  else if (((ulong)(*(long *)(in_RDI + 0x58) + (long)in_ECX) < *(ulong *)(in_RDI + 0x48)) ||
          (*(int *)(in_RDI + 0x38) != 0)) {
    iVar1 = (int)*(undefined8 *)(in_RDI + 0x58) - in_ESI;
    if (iVar1 == 0) {
      nk_str_append_text_char(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,0);
      local_4 = 1;
    }
    else {
      pvVar2 = nk_buffer_alloc((nk_buffer *)str,len,(nk_size)mem,(nk_size)src);
      if (pvVar2 == (void *)0x0) {
        local_4 = 0;
      }
      else {
        puVar3 = (undefined1 *)(*(long *)(in_RDI + 0x40) + (long)(in_ESI + in_ECX + iVar1 + -1));
        puVar4 = (undefined1 *)(*(long *)(in_RDI + 0x40) + (long)(in_ESI + iVar1 + -1));
        for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
          *puVar3 = *puVar4;
          puVar3 = puVar3 + -1;
          puVar4 = puVar4 + -1;
        }
        pvVar2 = (void *)(*(long *)(in_RDI + 0x40) + (long)in_ESI);
        nk_memcopy(pvVar2,in_RDX,(long)in_ECX);
        iVar1 = nk_utf_len((char *)CONCAT44(in_ECX,iVar5),(int)((ulong)pvVar2 >> 0x20));
        *(int *)(in_RDI + 0x78) = iVar1;
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

NK_API int
nk_str_insert_at_char(struct nk_str *s, int pos, const char *str, int len)
{
int i;
void *mem;
char *src;
char *dst;

int copylen;
NK_ASSERT(s);
NK_ASSERT(str);
NK_ASSERT(len >= 0);
if (!s || !str || !len || (nk_size)pos > s->buffer.allocated) return 0;
if ((s->buffer.allocated + (nk_size)len >= s->buffer.memory.size) &&
(s->buffer.type == NK_BUFFER_FIXED)) return 0;

copylen = (int)s->buffer.allocated - pos;
if (!copylen) {
nk_str_append_text_char(s, str, len);
return 1;
}
mem = nk_buffer_alloc(&s->buffer, NK_BUFFER_FRONT, (nk_size)len * sizeof(char), 0);
if (!mem) return 0;

/* memmove */
NK_ASSERT(((int)pos + (int)len + ((int)copylen - 1)) >= 0);
NK_ASSERT(((int)pos + ((int)copylen - 1)) >= 0);
dst = nk_ptr_add(char, s->buffer.memory.ptr, pos + len + (copylen - 1));
src = nk_ptr_add(char, s->buffer.memory.ptr, pos + (copylen-1));
for (i = 0; i < copylen; ++i) *dst-- = *src--;
mem = nk_ptr_add(void, s->buffer.memory.ptr, pos);
NK_MEMCPY(mem, str, (nk_size)len * sizeof(char));
s->len = nk_utf_len((char *)s->buffer.memory.ptr, (int)s->buffer.allocated);
return 1;
}